

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall
util::make_string<CylHead&,char_const(&)[24],unsigned_char&,char_const(&)[2]>
          (string *__return_storage_ptr__,util *this,CylHead *args,char (*args_1) [24],uchar *args_2
          ,char (*args_3) [2])

{
  ostringstream local_1a8 [8];
  ostringstream ss;
  char (*args_local_3) [2];
  uchar *args_local_2;
  char (*args_local_1) [24];
  CylHead *args_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ::operator<<((ostream *)local_1a8,(CylHead *)this);
  std::operator<<((ostream *)local_1a8,(char *)args);
  operator<<((ostream *)local_1a8,(*args_1)[0]);
  std::operator<<((ostream *)local_1a8,(char *)args_2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}